

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsvg.c
# Opt level: O0

FT_Error tt_face_load_svg_doc(FT_GlyphSlot glyph,FT_UInt glyph_index)

{
  FT_Byte *output;
  FT_Byte *uncomp_buffer;
  FT_ULong uncomp_size;
  FT_SVG_Document svg_document;
  FT_UShort doc_end_glyph_id;
  FT_Byte *pFStack_58;
  FT_UShort doc_start_glyph_id;
  FT_ULong doc_length;
  FT_ULong doc_offset;
  FT_Byte *doc;
  FT_ULong doc_limit;
  FT_Byte *doc_list;
  Svg *svg;
  FT_Memory memory;
  TT_Face face;
  FT_Error error;
  FT_UInt glyph_index_local;
  FT_GlyphSlot glyph_local;
  
  face._0_4_ = 0;
  memory = (FT_Memory)glyph->face;
  svg = (Svg *)((FT_Face)memory)->memory;
  doc_list = (FT_Byte *)((FT_Face)((long)memory + 0x4d8))->extensions;
  uncomp_size = (FT_ULong)glyph->other;
  doc_limit = *(FT_ULong *)(doc_list + 8);
  face._4_4_ = glyph_index;
  _error = glyph;
  face._0_4_ = find_doc((FT_Byte *)(doc_limit + 2),*(FT_UShort *)(doc_list + 2),glyph_index,
                        &doc_length,(FT_ULong *)&stack0xffffffffffffffa8,
                        (FT_UShort *)((long)&svg_document + 6),
                        (FT_UShort *)((long)&svg_document + 4));
  if ((FT_Error)face == 0) {
    doc = (FT_Byte *)(*(long *)(doc_list + 0x18) - (doc_limit - *(long *)(doc_list + 0x10)));
    if ((doc < doc_length) || (doc + -doc_length < pFStack_58)) {
      face._0_4_ = 8;
    }
    else {
      doc_offset = doc_limit + doc_length;
      if (((((FT_Byte *)0x6 < pFStack_58) && (*(char *)doc_offset == '\x1f')) &&
          (*(char *)(doc_offset + 1) == -0x75)) && (*(char *)(doc_offset + 2) == '\b')) {
        uncomp_buffer =
             (FT_Byte *)
             ((ulong)*(byte *)(doc_offset + (long)(pFStack_58 + -1)) << 0x18 |
              (ulong)*(byte *)(doc_offset + (long)(pFStack_58 + -2)) << 0x10 |
              (ulong)*(byte *)(doc_offset + (long)(pFStack_58 + -3)) << 8 |
             (ulong)*(byte *)(doc_offset + (long)(pFStack_58 + -4)));
        output = (FT_Byte *)ft_mem_qalloc((FT_Memory)svg,(FT_Long)uncomp_buffer,(FT_Error *)&face);
        if ((FT_Error)face != 0) {
          return (FT_Error)face;
        }
        face._0_4_ = FT_Gzip_Uncompress((FT_Memory)svg,output,(FT_ULong *)&uncomp_buffer,
                                        (FT_Byte *)doc_offset,(FT_ULong)pFStack_58);
        if ((FT_Error)face != 0) {
          ft_mem_free((FT_Memory)svg,output);
          return 8;
        }
        _error->internal->flags = _error->internal->flags | 2;
        pFStack_58 = uncomp_buffer;
        face._0_4_ = 0;
        doc_offset = (FT_ULong)output;
      }
      *(FT_ULong *)uncomp_size = doc_offset;
      *(FT_Byte **)(uncomp_size + 8) = pFStack_58;
      memcpy((void *)(uncomp_size + 0x10),&_error->face->size->metrics,0x38);
      *(FT_UShort *)(uncomp_size + 0x48) = _error->face->units_per_EM;
      *(undefined2 *)(uncomp_size + 0x4a) = svg_document._6_2_;
      *(undefined2 *)(uncomp_size + 0x4c) = svg_document._4_2_;
      *(undefined8 *)(uncomp_size + 0x50) = 0x10000;
      *(undefined8 *)(uncomp_size + 0x58) = 0;
      *(undefined8 *)(uncomp_size + 0x60) = 0;
      *(undefined8 *)(uncomp_size + 0x68) = 0x10000;
      *(undefined8 *)(uncomp_size + 0x70) = 0;
      *(undefined8 *)(uncomp_size + 0x78) = 0;
      _error->other = (void *)uncomp_size;
    }
  }
  return (FT_Error)face;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_svg_doc( FT_GlyphSlot  glyph,
                        FT_UInt       glyph_index )
  {
    FT_Error   error  = FT_Err_Ok;
    TT_Face    face   = (TT_Face)glyph->face;
    FT_Memory  memory = face->root.memory;
    Svg*       svg    = (Svg*)face->svg;

    FT_Byte*  doc_list;
    FT_ULong  doc_limit;

    FT_Byte*   doc;
    FT_ULong   doc_offset;
    FT_ULong   doc_length;
    FT_UShort  doc_start_glyph_id;
    FT_UShort  doc_end_glyph_id;

    FT_SVG_Document  svg_document = (FT_SVG_Document)glyph->other;


    FT_ASSERT( !( svg == NULL ) );

    doc_list = svg->svg_doc_list;

    error = find_doc( doc_list + 2, svg->num_entries, glyph_index,
                                    &doc_offset, &doc_length,
                                    &doc_start_glyph_id, &doc_end_glyph_id );
    if ( error != FT_Err_Ok )
      goto Exit;

    doc_limit = svg->table_size -
                  (FT_ULong)( doc_list - (FT_Byte*)svg->table );
    if ( doc_offset > doc_limit              ||
         doc_length > doc_limit - doc_offset )
    {
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    doc = doc_list + doc_offset;

    if ( doc_length > 6 &&
         doc[0] == 0x1F &&
         doc[1] == 0x8B &&
         doc[2] == 0x08 )
    {
#ifdef FT_CONFIG_OPTION_USE_ZLIB

      FT_ULong  uncomp_size;
      FT_Byte*  uncomp_buffer = NULL;


      /*
       * Get the size of the original document.  This helps in allotting the
       * buffer to accommodate the uncompressed version.  The last 4 bytes
       * of the compressed document are equal to the original size modulo
       * 2^32.  Since the size of SVG documents is less than 2^32 bytes we
       * can use this accurately.  The four bytes are stored in
       * little-endian format.
       */
      FT_TRACE4(( "SVG document is GZIP compressed\n" ));
      uncomp_size = (FT_ULong)doc[doc_length - 1] << 24 |
                    (FT_ULong)doc[doc_length - 2] << 16 |
                    (FT_ULong)doc[doc_length - 3] << 8  |
                    (FT_ULong)doc[doc_length - 4];

      if ( FT_QALLOC( uncomp_buffer, uncomp_size ) )
        goto Exit;

      error = FT_Gzip_Uncompress( memory,
                                  uncomp_buffer,
                                  &uncomp_size,
                                  doc,
                                  doc_length );
      if ( error )
      {
        FT_FREE( uncomp_buffer );
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      glyph->internal->flags |= FT_GLYPH_OWN_GZIP_SVG;

      doc        = uncomp_buffer;
      doc_length = uncomp_size;

#else /* !FT_CONFIG_OPTION_USE_ZLIB */

      error = FT_THROW( Unimplemented_Feature );
      goto Exit;

#endif /* !FT_CONFIG_OPTION_USE_ZLIB */
    }

    svg_document->svg_document        = doc;
    svg_document->svg_document_length = doc_length;

    svg_document->metrics      = glyph->face->size->metrics;
    svg_document->units_per_EM = glyph->face->units_per_EM;

    svg_document->start_glyph_id = doc_start_glyph_id;
    svg_document->end_glyph_id   = doc_end_glyph_id;

    svg_document->transform.xx = 0x10000;
    svg_document->transform.xy = 0;
    svg_document->transform.yx = 0;
    svg_document->transform.yy = 0x10000;

    svg_document->delta.x = 0;
    svg_document->delta.y = 0;

    FT_TRACE5(( "start_glyph_id: %d\n", doc_start_glyph_id ));
    FT_TRACE5(( "end_glyph_id:   %d\n", doc_end_glyph_id ));
    FT_TRACE5(( "svg_document:\n" ));
    FT_TRACE5(( " %.*s\n", (FT_UInt)doc_length, doc ));

    glyph->other = svg_document;

  Exit:
    return error;
  }